

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

int Kit_TruthBestCofVar(uint *pTruth,int nVars,uint *pCof0,uint *pCof1)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar;
  int iVar7;
  int iVar_00;
  
  uVar4 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
  uVar5 = uVar4;
  if (nVars < 6) {
    uVar4 = 1;
    uVar5 = uVar4;
  }
  do {
    if ((int)uVar4 < 1) {
      return -1;
    }
    lVar1 = uVar4 - 1;
    uVar4 = uVar4 - 1;
  } while (pTruth[lVar1] == 0);
  do {
    if ((int)uVar5 < 1) {
      return -1;
    }
    lVar1 = uVar5 - 1;
    uVar5 = uVar5 - 1;
  } while (pTruth[lVar1] == 0xffffffff);
  iVar_00 = 0;
  iVar6 = 0;
  if (0 < nVars) {
    iVar6 = nVars;
  }
  iVar7 = 100000000;
  iVar = -1;
  for (; iVar6 != iVar_00; iVar_00 = iVar_00 + 1) {
    Kit_TruthCofactor0New(pCof0,pTruth,nVars,iVar_00);
    Kit_TruthCofactor1New(pCof1,pTruth,nVars,iVar_00);
    iVar2 = Kit_TruthSupportSize(pCof0,nVars);
    iVar3 = Kit_TruthSupportSize(pCof1,nVars);
    iVar3 = iVar3 + iVar2;
    if (iVar3 < iVar7) {
      iVar = iVar_00;
    }
    if (iVar3 <= iVar7) {
      iVar7 = iVar3;
    }
  }
  if (iVar == -1) {
    __assert_fail("iBestVar != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitTruth.c"
                  ,0x56c,
                  "int Kit_TruthBestCofVar(unsigned int *, int, unsigned int *, unsigned int *)");
  }
  Kit_TruthCofactor0New(pCof0,pTruth,nVars,iVar);
  Kit_TruthCofactor1New(pCof1,pTruth,nVars,iVar);
  return iVar;
}

Assistant:

int Kit_TruthBestCofVar( unsigned * pTruth, int nVars, unsigned * pCof0, unsigned * pCof1 )
{
    int i, iBestVar, nSuppSizeCur0, nSuppSizeCur1, nSuppSizeCur, nSuppSizeMin;
    if ( Kit_TruthIsConst0(pTruth, nVars) || Kit_TruthIsConst1(pTruth, nVars) )
        return -1;
    // iterate through variables
    iBestVar = -1;
    nSuppSizeMin = KIT_INFINITY;
    for ( i = 0; i < nVars; i++ )
    {
        // cofactor the functiona and get support sizes
        Kit_TruthCofactor0New( pCof0, pTruth, nVars, i );
        Kit_TruthCofactor1New( pCof1, pTruth, nVars, i );
        nSuppSizeCur0 = Kit_TruthSupportSize( pCof0, nVars );
        nSuppSizeCur1 = Kit_TruthSupportSize( pCof1, nVars );
        nSuppSizeCur  = nSuppSizeCur0 + nSuppSizeCur1;
        // compare this variable with other variables
        if ( nSuppSizeMin > nSuppSizeCur ) 
        {
            nSuppSizeMin = nSuppSizeCur;
            iBestVar = i;
        }
    }
    assert( iBestVar != -1 );
    // cofactor w.r.t. this variable
    Kit_TruthCofactor0New( pCof0, pTruth, nVars, iBestVar );
    Kit_TruthCofactor1New( pCof1, pTruth, nVars, iBestVar );
    return iBestVar;
}